

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_cle_s_w_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  fpr_t *pfVar3;
  float32 fVar4;
  float32 fVar5;
  float32 fVar6;
  float32 fVar7;
  float32 fVar8;
  float32 fVar9;
  
  pfVar1 = (env->active_fpu).fpr + ws;
  fVar4 = pfVar1->fs[1];
  fVar5 = pfVar1->fs[2];
  fVar6 = pfVar1->fs[3];
  pfVar2 = (env->active_fpu).fpr + wt;
  fVar7 = pfVar2->fs[1];
  fVar8 = pfVar2->fs[2];
  fVar9 = pfVar2->fs[3];
  pfVar3 = (env->active_fpu).fpr + wd;
  pfVar3->fs[0] = -(uint)((int)pfVar2->fs[0] < (int)pfVar1->fs[0]) ^ 0xffffffff;
  pfVar3->fs[1] = -(uint)((int)fVar7 < (int)fVar4) ^ 0xffffffff;
  pfVar3->fs[2] = -(uint)((int)fVar8 < (int)fVar5) ^ 0xffffffff;
  pfVar3->fs[3] = -(uint)((int)fVar9 < (int)fVar6) ^ 0xffffffff;
  return;
}

Assistant:

void helper_msa_cle_s_w(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->w[0]  = msa_cle_s_df(DF_WORD, pws->w[0],  pwt->w[0]);
    pwd->w[1]  = msa_cle_s_df(DF_WORD, pws->w[1],  pwt->w[1]);
    pwd->w[2]  = msa_cle_s_df(DF_WORD, pws->w[2],  pwt->w[2]);
    pwd->w[3]  = msa_cle_s_df(DF_WORD, pws->w[3],  pwt->w[3]);
}